

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_coders_info *val;
  uint *puVar2;
  _7z_stream_info *si;
  uint64_t uVar3;
  _7z_stream_info *si_00;
  size_t sVar4;
  uchar uVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  uchar *p;
  uLong uVar9;
  int64_t iVar10;
  uint64_t *puVar11;
  uint32_t *puVar12;
  archive_string_conv *paVar13;
  int *piVar14;
  char *pcVar15;
  uchar *puVar16;
  undefined8 extraout_RAX;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  void *pvVar20;
  uchar *puVar21;
  long lVar22;
  _7z_coder *p_Var23;
  _7z_coder *p_Var24;
  char *pcVar25;
  long lVar26;
  size_t b;
  _7z_folder *p_Var27;
  size_t rbytes;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint64_t uVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar34;
  _7z_folder *p_Var35;
  char *pcVar36;
  long lVar37;
  uint uVar38;
  ulong uVar39;
  bool bVar40;
  uint64_t *local_a0;
  size_t local_90;
  uint64_t size;
  _7z_folder *local_70;
  undefined4 local_64;
  int64_t offset;
  _7z_header_info header;
  
  si = (_7z_stream_info *)a->format->data;
  if (*(int *)&si[199].pi.digest.digests == -1) {
    *(undefined4 *)&si[199].pi.digest.digests = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders != (_7z_folder *)0x0) {
    puVar11 = si[1].pi.positions;
    p_Var35 = (_7z_folder *)(si[1].ci.dataStreamIndex + 0x58);
    goto LAB_00402705;
  }
  header.emptyFileBools = (uchar *)0x0;
  header.antiBools = (uchar *)0x0;
  header.dataIndex = 0;
  header.emptyStreamBools = (uchar *)0x0;
  header.attrBools = (uchar *)0x0;
  piVar14 = (int *)__archive_read_ahead(a,0x20,&offset);
  iVar8 = -0x1e;
  if (piVar14 == (int *)0x0) {
LAB_004026b5:
    bVar40 = false;
  }
  else {
    if ((((char)*piVar14 == 'M') && (*(char *)((long)piVar14 + 1) == 'Z')) ||
       (*piVar14 == 0x464c457f)) {
      if (offset < 0x27001) {
        iVar10 = __archive_read_seek(a,0x27000,0);
        if (iVar10 < 0) goto LAB_004026b5;
      }
      else {
        __archive_read_consume(a,0x27000);
      }
      lVar37 = 0;
      uVar39 = 1;
      do {
        while( true ) {
          uVar19 = uVar39;
          if (0x39000 < uVar19 + lVar37) goto LAB_004025f3;
          pcVar25 = (char *)__archive_read_ahead(a,uVar19,(ssize_t *)&size);
          if (pcVar25 == (char *)0x0) break;
          uVar39 = 0x1000;
          if (5 < (long)size) {
            pcVar36 = pcVar25 + size;
            for (pcVar15 = pcVar25; pcVar15 + 0x20 < pcVar36; pcVar15 = pcVar15 + uVar29) {
              uVar29 = check_7zip_header_in_sfx(pcVar15);
              if (uVar29 == 0) {
                pvVar20 = a->format->data;
                __archive_read_consume(a,(long)pcVar15 - (long)pcVar25);
                *(long *)((long)pvVar20 + 0x88) = lVar37 + ((long)pcVar15 - (long)pcVar25) + 0x27000
                ;
                piVar14 = (int *)__archive_read_ahead(a,0x20,&offset);
                iVar8 = -0x1e;
                if (piVar14 != (int *)0x0) goto LAB_004024dd;
                goto LAB_004026b5;
              }
            }
            __archive_read_consume(a,(long)pcVar15 - (long)pcVar25);
            lVar37 = lVar37 + ((long)pcVar15 - (long)pcVar25);
            uVar39 = uVar19;
            if (uVar19 == 1) {
              uVar39 = 0x1000;
            }
          }
        }
        uVar39 = uVar19 >> 1;
      } while (0x7f < uVar19);
LAB_004025f3:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
      iVar8 = -0x1e;
      goto LAB_004026b5;
    }
LAB_004024dd:
    iVar8 = -0x1e;
    ppuVar1 = &si[1].pi.digest.digests;
    *ppuVar1 = *ppuVar1 + 8;
    iVar7 = bcmp(piVar14,anon_var_dwarf_8ef83e,6);
    if (iVar7 != 0) {
      pcVar25 = "Not 7-Zip archive file";
LAB_004026a6:
      archive_set_error(&a->archive,-1,pcVar25);
      goto LAB_004026b5;
    }
    uVar9 = cm_zlib_crc32(0,(uchar *)(piVar14 + 3),0x14);
    if (uVar9 != (uint)piVar14[2]) {
      pcVar25 = "Header CRC error";
      goto LAB_004026a6;
    }
    uVar31 = *(uint64_t *)(piVar14 + 5);
    if (uVar31 == 0) {
      iVar8 = 1;
      goto LAB_004026b5;
    }
    puVar11 = *(uint64_t **)(piVar14 + 3);
    if ((long)puVar11 < 0) {
LAB_004035b6:
      pcVar25 = "Malformed 7-Zip archive";
LAB_004035c5:
      archive_set_error(&a->archive,-1,pcVar25);
LAB_004035d1:
      bVar40 = false;
      iVar8 = -0x1e;
    }
    else {
      local_a0 = (uint64_t *)(ulong)(uint)piVar14[7];
      __archive_read_consume(a,0x20);
      if (puVar11 != (uint64_t *)0x0) {
        if ((long)puVar11 <= offset) {
          __archive_read_consume(a,(int64_t)puVar11);
          goto LAB_00402acb;
        }
        iVar10 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar11,0);
        if (-1 < iVar10) goto LAB_00402acb;
        goto LAB_004035d1;
      }
LAB_00402acb:
      si[2].pi.positions = puVar11;
      si[1].pi.digest.defineds = (uchar *)puVar11;
      si[1].pi.numPackStreams = uVar31;
      si[1].pi.sizes = (uint64_t *)0x0;
      si[1].pi.pos = 1;
      *(undefined4 *)&si[199].pi.digest.digests = 0;
      puVar16 = header_bytes(a,1);
      if (puVar16 == (uchar *)0x0) {
        archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
        goto LAB_004035d1;
      }
      iVar8 = -0x1e;
      if (*puVar16 == '\x17') {
        pvVar20 = a->format->data;
        piVar14 = __errno_location();
        *piVar14 = 0;
        iVar8 = read_StreamsInfo(a,si);
        if (iVar8 < 0) {
          pcVar25 = "Malformed 7-Zip archive";
          if (*piVar14 == 0xc) {
            pcVar25 = "Couldn\'t allocate memory";
          }
LAB_00402c4c:
          archive_set_error(&a->archive,-1,pcVar25);
          iVar8 = -0x1e;
LAB_00402c5f:
          bVar40 = true;
        }
        else {
          pcVar25 = "Malformed 7-Zip archive";
          if (((si->pi).numPackStreams == 0) || ((si->ci).numFolders == 0)) goto LAB_00402c4c;
          uVar31 = (si->pi).pos;
          pcVar25 = "Malformed Header offset";
          if ((((long)uVar31 < 0) ||
              ((uVar3 = *(si->pi).sizes, uVar3 == 0 ||
               (uVar39 = uVar3 + uVar31, *(ulong *)((long)pvVar20 + 0x80) < uVar39)))) ||
             ((long)uVar39 < 0)) goto LAB_00402c4c;
          if (si[1].pi.sizes != local_a0) {
            iVar8 = -1;
            archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
            goto LAB_00402c5f;
          }
          p_Var35 = (si->ci).folders;
          bVar40 = p_Var35->digest_defined != '\0';
          if (bVar40) {
            local_a0 = (uint64_t *)(ulong)p_Var35->digest;
          }
          if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
            read_consume(a);
            p_Var35 = (si->ci).folders;
          }
          iVar8 = setup_decode_folder(a,p_Var35,1);
          if (iVar8 == 0) {
            si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
            iVar8 = seek_pack(a);
          }
        }
        free_StreamsInfo(si);
        (si->ss).unpackSizes = (uint64_t *)0x0;
        (si->ss).digestsDefined = (uchar *)0x0;
        (si->ci).dataStreamIndex = 0;
        (si->ss).unpack_streams = 0;
        (si->ci).numFolders = 0;
        (si->ci).folders = (_7z_folder *)0x0;
        (si->pi).digest.digests = (uint32_t *)0x0;
        (si->pi).positions = (uint64_t *)0x0;
        (si->pi).sizes = (uint64_t *)0x0;
        (si->pi).digest.defineds = (uchar *)0x0;
        (si->pi).pos = 0;
        (si->pi).numPackStreams = 0;
        (si->ss).digests = (uint32_t *)0x0;
        if (-1 < iVar8) {
          *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
          si[1].pi.sizes = (uint64_t *)0x0;
          local_64 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),!bVar40);
          goto LAB_00402cb5;
        }
        goto LAB_004035d1;
      }
      if (*puVar16 == '\x01') {
        local_64 = 0;
        piVar14 = __errno_location();
LAB_00402cb5:
        *piVar14 = 0;
        si_00 = (_7z_stream_info *)a->format->data;
        if (((*(int *)((long)&si[1].pi.pos + 4) == 0) ||
            ((puVar16 = header_bytes(a,1), puVar16 != (uchar *)0x0 && (*puVar16 == '\x01')))) &&
           (puVar16 = header_bytes(a,1), puVar16 != (uchar *)0x0)) {
          uVar5 = *puVar16;
          if (uVar5 == '\x02') {
            do {
              puVar16 = header_bytes(a,1);
              if (puVar16 == (uchar *)0x0) break;
              if (*puVar16 == '\0') {
                puVar16 = header_bytes(a,1);
                if (puVar16 != (uchar *)0x0) {
                  uVar5 = *puVar16;
                  goto LAB_00402d63;
                }
                break;
              }
              iVar8 = parse_7zip_uint64(a,&size);
            } while (-1 < iVar8);
          }
          else {
LAB_00402d63:
            if (uVar5 == '\x04') {
              iVar8 = read_StreamsInfo(a,si_00);
              if ((iVar8 < 0) || (puVar16 = header_bytes(a,1), puVar16 == (uchar *)0x0))
              goto LAB_0040336c;
              uVar5 = *puVar16;
            }
            if (uVar5 == '\0') {
LAB_0040359e:
              puVar16 = header_bytes(a,1);
              if ((puVar16 == (uchar *)0x0) || (*puVar16 != '\0')) goto LAB_004035b6;
              if (((char)local_64 == '\0') && (si[1].pi.sizes != local_a0)) {
                pcVar25 = "Malformed 7-Zip archive";
                goto LAB_004035c5;
              }
              si[2].pi.digest.digests = (uint32_t *)0x0;
              si[2].ss.unpackSizes = (uint64_t *)0x0;
              *(undefined4 *)&si[1].pi.pos = 0;
              si[2].ci.folders = (_7z_folder *)0x0;
              si[2].ci.dataStreamIndex = 0;
              iVar8 = 0;
              bVar40 = true;
              goto LAB_004026ba;
            }
            if (uVar5 == '\x05') {
              val = &si_00[1].ci;
              iVar8 = parse_7zip_uint64(a,&val->numFolders);
              if ((-1 < iVar8) && (val->numFolders < 0xf4241)) {
                local_70 = (_7z_folder *)calloc(val->numFolders,0x58);
                si_00[1].ci.folders = local_70;
                if (local_70 != (_7z_folder *)0x0) {
                  local_90 = 0;
                  do {
                    puVar16 = header_bytes(a,1);
                    if (puVar16 == (uchar *)0x0) break;
                    uVar5 = *puVar16;
                    if (uVar5 == '\0') {
                      p_Var35 = (si_00->ci).folders;
                      uVar29 = 0;
                      uVar34 = 0;
                      uVar32 = 0;
                      iVar8 = 0;
                      iVar7 = 0;
                      goto LAB_004033bf;
                    }
                    iVar8 = parse_7zip_uint64(a,&size);
                    uVar31 = size;
                    if ((iVar8 < 0) || (si_00[1].pi.numPackStreams < size)) break;
                    switch(uVar5) {
                    case '\x0e':
                      sVar4 = val->numFolders;
                      puVar16 = (uchar *)calloc(sVar4,1);
                      header.emptyStreamBools = puVar16;
                      if ((puVar16 == (uchar *)0x0) ||
                         (iVar8 = read_Bools(a,puVar16,sVar4), iVar8 < 0)) goto LAB_0040336c;
                      local_90 = 0;
                      for (uVar29 = 0; (ulong)uVar29 < val->numFolders; uVar29 = uVar29 + 1) {
                        local_90 = (size_t)(((int)local_90 + 1) - (uint)(puVar16[uVar29] == '\0'));
                      }
                      break;
                    case '\x0f':
                      if ((int)local_90 < 1) goto switchD_00402e71_default;
                      puVar16 = (uchar *)calloc(local_90,1);
                      header.emptyFileBools = puVar16;
LAB_004031ec:
                      if ((puVar16 == (uchar *)0x0) ||
                         (iVar8 = read_Bools(a,puVar16,local_90), iVar8 < 0)) goto LAB_0040336c;
                      break;
                    case '\x10':
                      if (0 < (int)local_90) {
                        puVar16 = (uchar *)calloc(local_90,1);
                        header.antiBools = puVar16;
                        goto LAB_004031ec;
                      }
                    default:
switchD_00402e71_default:
                      puVar16 = header_bytes(a,size);
                      if (puVar16 == (uchar *)0x0) goto LAB_0040336c;
                      break;
                    case '\x11':
                      puVar16 = header_bytes(a,1);
                      if (((puVar16 == (uchar *)0x0) || (uVar39 = uVar31 - 1, (uVar39 & 1) != 0)) ||
                         (uVar39 < val->numFolders << 2)) goto LAB_0040336c;
                      pvVar20 = malloc(uVar39);
                      si_00[1].ss.unpack_streams = (size_t)pvVar20;
                      uVar19 = uVar39;
                      if (pvVar20 == (void *)0x0) goto LAB_0040336c;
                      for (; uVar19 != 0; uVar19 = uVar19 - rbytes) {
                        rbytes = 0x10000;
                        if (uVar19 < 0x10000) {
                          rbytes = uVar19;
                        }
                        puVar16 = header_bytes(a,rbytes);
                        if (puVar16 == (uchar *)0x0) goto LAB_0040336c;
                        memcpy(pvVar20,puVar16,rbytes);
                        pvVar20 = (void *)((long)pvVar20 + rbytes);
                      }
                      uVar19 = si_00[1].ci.numFolders;
                      p_Var23 = (_7z_coder *)si_00[1].ss.unpack_streams;
                      for (uVar29 = 0; uVar18 = (ulong)uVar29, uVar18 < uVar19; uVar29 = uVar29 + 1)
                      {
                        (&local_70->coders)[uVar18 * 0xb] = p_Var23;
                        uVar31 = 0;
                        uVar33 = uVar39;
                        p_Var24 = p_Var23;
                        while( true ) {
                          p_Var23 = (_7z_coder *)((long)&p_Var24->codec + 2);
                          if (uVar33 < 2) goto LAB_0040336c;
                          if (((char)p_Var24->codec == '\0') &&
                             (*(undefined1 *)((long)&p_Var24->codec + 1) == '\0')) break;
                          uVar33 = uVar33 - 2;
                          uVar31 = uVar31 + 2;
                          p_Var24 = p_Var23;
                        }
                        (&local_70->numCoders)[uVar18 * 0xb] = uVar31;
                        uVar39 = (uVar39 - uVar31) - 2;
                      }
                      break;
                    case '\x12':
                    case '\x13':
                    case '\x14':
                      pvVar20 = a->format->data;
                      lVar37 = *(long *)((long)pvVar20 + 0xa0);
                      puVar16 = (uchar *)calloc(*(size_t *)((long)pvVar20 + 0x98),1);
                      if (puVar16 == (uchar *)0x0) goto LAB_0040336c;
                      puVar21 = header_bytes(a,1);
                      if (puVar21 != (uchar *)0x0) {
                        if (*puVar21 == '\0') {
                          iVar8 = read_Bools(a,puVar16,*(size_t *)((long)pvVar20 + 0x98));
                          if (iVar8 < 0) goto LAB_00403364;
                        }
                        else {
                          memset(puVar16,1,*(size_t *)((long)pvVar20 + 0x98));
                        }
                        puVar21 = header_bytes(a,1);
                        if ((puVar21 != (uchar *)0x0) &&
                           ((*puVar21 == '\0' ||
                            ((iVar8 = parse_7zip_uint64(a,&header.dataIndex), -1 < iVar8 &&
                             (header.dataIndex < 0xf4241)))))) {
                          for (uVar29 = 0; uVar39 = (ulong)uVar29,
                              uVar39 < *(ulong *)((long)pvVar20 + 0x98); uVar29 = uVar29 + 1) {
                            if (puVar16[uVar39] != '\0') {
                              puVar17 = (ulong *)header_bytes(a,8);
                              if (puVar17 == (ulong *)0x0) goto LAB_00403364;
                              if (uVar5 == '\x14') {
                                if (*puVar17 < 0x19db1ded53e8000) {
                                  uVar19 = 0;
                                  lVar22 = 0;
                                }
                                else {
                                  uVar18 = *puVar17 + 0xfe624e212ac18000;
                                  uVar19 = uVar18 / 10000000;
                                  lVar22 = (uVar18 % 10000000) * 100;
                                }
                                lVar26 = uVar39 * 0x58 + lVar37;
                                *(ulong *)(lVar26 + 0x20) = uVar19;
                                *(long *)(lVar26 + 0x38) = lVar22;
                                uVar32 = 1;
                              }
                              else if (uVar5 == '\x13') {
                                if (*puVar17 < 0x19db1ded53e8000) {
                                  uVar19 = 0;
                                  lVar22 = 0;
                                }
                                else {
                                  uVar18 = *puVar17 + 0xfe624e212ac18000;
                                  uVar19 = uVar18 / 10000000;
                                  lVar22 = (uVar18 % 10000000) * 100;
                                }
                                lVar26 = uVar39 * 0x58 + lVar37;
                                *(ulong *)(lVar26 + 0x28) = uVar19;
                                *(long *)(lVar26 + 0x40) = lVar22;
                                uVar32 = 2;
                              }
                              else {
                                if (uVar5 != '\x12') goto LAB_00403053;
                                if (*puVar17 < 0x19db1ded53e8000) {
                                  uVar19 = 0;
                                  lVar22 = 0;
                                }
                                else {
                                  uVar18 = *puVar17 + 0xfe624e212ac18000;
                                  uVar19 = uVar18 / 10000000;
                                  lVar22 = (uVar18 % 10000000) * 100;
                                }
                                lVar26 = uVar39 * 0x58 + lVar37;
                                *(ulong *)(lVar26 + 0x30) = uVar19;
                                *(long *)(lVar26 + 0x48) = lVar22;
                                uVar32 = 4;
                              }
                              puVar2 = (uint *)(lVar37 + 0x18 + uVar39 * 0x58);
                              *puVar2 = *puVar2 | uVar32;
                            }
LAB_00403053:
                          }
                          free(puVar16);
                          break;
                        }
                      }
LAB_00403364:
                      free(puVar16);
                      goto LAB_0040336c;
                    case '\x15':
                      puVar16 = header_bytes(a,2);
                      if (puVar16 == (uchar *)0x0) goto LAB_0040336c;
                      uVar5 = *puVar16;
                      sVar4 = val->numFolders;
                      puVar16 = (uchar *)calloc(sVar4,1);
                      header.attrBools = puVar16;
                      if (puVar16 == (uchar *)0x0) goto LAB_0040336c;
                      if (uVar5 == '\0') {
                        iVar8 = read_Bools(a,puVar16,sVar4);
                        if (iVar8 < 0) goto LAB_0040336c;
                      }
                      else {
                        memset(puVar16,1,sVar4);
                      }
                      for (uVar29 = 0; uVar39 = (ulong)uVar29, uVar39 < val->numFolders;
                          uVar29 = uVar29 + 1) {
                        if (puVar16[uVar39] != '\0') {
                          puVar21 = header_bytes(a,4);
                          if (puVar21 == (uchar *)0x0) goto LAB_0040336c;
                          *(undefined4 *)((long)&local_70->numUnpackStreams + uVar39 * 0x58 + 4) =
                               *(undefined4 *)puVar21;
                        }
                      }
                    }
                  } while( true );
                }
              }
            }
          }
        }
LAB_0040336c:
        if (*piVar14 == 0xc) {
          pcVar25 = "Couldn\'t allocate memory";
        }
        else {
          pcVar25 = "Damaged 7-Zip archive";
        }
        goto LAB_004035c5;
      }
      bVar40 = false;
      archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
    }
  }
LAB_004026ba:
  free(header.emptyStreamBools);
  free(header.emptyFileBools);
  free(header.antiBools);
  free(header.attrBools);
  if (!bVar40) {
    return iVar8;
  }
  puVar11 = (uint64_t *)si[1].ci.numFolders;
  p_Var35 = si[1].ci.folders;
  si[1].pi.positions = puVar11;
LAB_00402705:
  si[1].ci.dataStreamIndex = (uint64_t)p_Var35;
  if (puVar11 == (uint64_t *)0x0) {
    iVar8 = 1;
  }
  else {
    si[1].pi.positions = (uint64_t *)((long)puVar11 + -1);
    si[1].ss.unpackSizes = (uint64_t *)0x0;
    *(undefined1 *)&si[2].pi.pos = 0;
    puVar12 = (uint32_t *)cm_zlib_crc32(0,(uchar *)0x0,0);
    si[1].ss.digests = puVar12;
    if (si[0xc6].ci.dataStreamIndex == 0) {
      paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
      si[0xc6].ci.dataStreamIndex = (uint64_t)paVar13;
      if (paVar13 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
    }
    if (((p_Var35 != (_7z_folder *)0x0) &&
        (uVar39 = (ulong)(uint)p_Var35->numBindPairs, uVar39 < (si->ci).numFolders)) &&
       (p_Var27 = (si->ci).folders, p_Var27 != (_7z_folder *)0x0)) {
      p_Var27 = p_Var27 + uVar39;
      lVar37 = 0;
      for (uVar39 = 0; uVar39 < p_Var27->numCoders; uVar39 = uVar39 + 1) {
        lVar22 = *(long *)((long)&p_Var27->coders->codec + lVar37);
        if (((lVar22 == 0x6f10101) || (lVar22 == 0x6f10701)) || (lVar22 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[199].pi.digest.digests = 1;
        }
        lVar37 = lVar37 + 0x28;
      }
    }
    if (*(int *)&si[199].pi.digest.digests == -1) {
      *(undefined4 *)&si[199].pi.digest.digests = 0;
    }
    wVar6 = _archive_entry_copy_pathname_l
                      (entry,(char *)p_Var35->coders,p_Var35->numCoders,
                       (archive_string_conv *)si[0xc6].ci.dataStreamIndex);
    if (wVar6 == L'\0') {
      iVar8 = 0;
    }
    else {
      piVar14 = __errno_location();
      if (*piVar14 == 0xc) {
        pcVar25 = "Can\'t allocate memory for Pathname";
LAB_004029dc:
        archive_set_error(&a->archive,0xc,pcVar25);
        return -0x1e;
      }
      pcVar25 = archive_string_conversion_charset_name
                          ((archive_string_conv *)si[0xc6].ci.dataStreamIndex);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar25);
      iVar8 = -0x14;
    }
    archive_entry_set_mode(entry,(mode_t)p_Var35->numUnpackStreams);
    uVar29 = *(uint *)&p_Var35->bindPairs;
    if ((uVar29 & 1) != 0) {
      archive_entry_set_mtime(entry,p_Var35->numPackedStreams,p_Var35->numOutStreams);
      uVar29 = *(uint *)&p_Var35->bindPairs;
    }
    if ((uVar29 & 4) != 0) {
      lVar37._0_1_ = p_Var35->digest_defined;
      lVar37._1_3_ = *(undefined3 *)&p_Var35->field_0x49;
      lVar37._4_4_ = p_Var35->digest;
      archive_entry_set_ctime(entry,p_Var35->numInStreams,lVar37);
      uVar29 = *(uint *)&p_Var35->bindPairs;
    }
    if ((uVar29 & 2) != 0) {
      archive_entry_set_atime(entry,(time_t)p_Var35->packedStreams,(long)p_Var35->unPackSize);
    }
    uVar39 = (ulong)*(uint *)((long)&p_Var35->numBindPairs + 4);
    if (uVar39 == 0xffffffff) {
      puVar16 = (uchar *)0x0;
    }
    else {
      puVar16 = (uchar *)(si->ss).unpackSizes[uVar39];
    }
    si[1].ss.digestsDefined = puVar16;
    archive_entry_set_size(entry,(int64_t)puVar16);
    puVar16 = si[1].ss.digestsDefined;
    if (puVar16 == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if ((p_Var35->numUnpackStreams & 0xf000) == 0xa000) {
      lVar37 = 0;
      pcVar25 = (char *)0x0;
      while (puVar16 != (uchar *)0x0) {
        iVar7 = archive_read_format_7zip_read_data(a,(void **)&header,&size,&offset);
        uVar31 = size;
        if (iVar7 < -0x14) {
          free(pcVar25);
          return iVar7;
        }
        pcVar15 = (char *)realloc(pcVar25,size + lVar37 + 1);
        if (pcVar15 == (char *)0x0) {
          free(pcVar25);
          pcVar25 = "Can\'t allocate memory for Symname";
          goto LAB_004029dc;
        }
        memcpy(pcVar15 + lVar37,(void *)header.dataIndex,uVar31);
        lVar37 = lVar37 + uVar31;
        pcVar25 = pcVar15;
        puVar16 = si[1].ss.digestsDefined;
      }
      if (lVar37 == 0) {
        uVar29 = (uint)p_Var35->numUnpackStreams & 0xffff0fff | 0x8000;
        *(uint *)&p_Var35->numUnpackStreams = uVar29;
        archive_entry_set_mode(entry,uVar29);
      }
      else {
        pcVar25[lVar37] = '\0';
        archive_entry_copy_symlink(entry,pcVar25);
      }
      free(pcVar25);
      archive_entry_set_size(entry,0);
    }
    *(undefined2 *)((long)&si[0xc6].ss.unpack_streams + 4) = 0x70;
    *(undefined4 *)&si[0xc6].ss.unpack_streams = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc6].ss;
  }
  return iVar8;
LAB_004033bf:
  uVar39 = (ulong)uVar32;
  if (val->numFolders <= uVar39) goto LAB_0040359e;
  if ((header.emptyStreamBools == (uchar *)0x0) || (header.emptyStreamBools[uVar39] == '\0')) {
    uVar30 = *(uint *)(&local_70->bindPairs + uVar39 * 0xb) | 0x10;
    *(uint *)(&local_70->bindPairs + uVar39 * 0xb) = uVar30;
  }
  else {
    uVar30 = *(uint *)(&local_70->bindPairs + uVar39 * 0xb);
  }
  puVar11 = &local_70->numCoders + uVar39 * 0xb;
  uVar28 = *(uint *)((long)&local_70->numUnpackStreams + uVar39 * 0x58 + 4);
  uVar38 = uVar28 >> 0x10;
  *(uint *)(&local_70->numUnpackStreams + uVar39 * 0xb) = uVar38;
  if ((uVar30 & 0x10) == 0) {
    if (header.emptyFileBools == (uchar *)0x0) {
      if (0xffff < uVar28) {
        bVar40 = false;
        goto LAB_004034b8;
      }
LAB_004034ad:
      *(undefined4 *)(puVar11 + 10) = 0x41ff;
LAB_004034ef:
      uVar39 = *puVar11;
      if ((1 < uVar39) &&
         ((p_Var23 = (_7z_coder *)puVar11[1], *(char *)((long)p_Var23 + (uVar39 - 2)) != '/' ||
          (*(char *)((long)p_Var23 + (uVar39 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var23->codec + uVar39) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar11[1])->codec + *puVar11 + 1) = 0;
        *puVar11 = *puVar11 + 2;
        uVar28 = *(uint *)((long)puVar11 + 0x54);
      }
    }
    else {
      lVar37 = (long)iVar8;
      bVar40 = header.emptyFileBools[lVar37] != '\0';
      iVar8 = iVar8 + 1;
      if (uVar28 < 0x10000) {
        if (header.emptyFileBools[lVar37] == '\0') goto LAB_004034ad;
        *(undefined4 *)(puVar11 + 10) = 0x81b6;
      }
      else {
LAB_004034b8:
        if (((uVar28 & 0xf0000000) != 0x40000000) && (!bVar40)) {
          uVar38 = uVar38 & 0xfff | 0x4000;
          *(uint *)(puVar11 + 10) = uVar38;
        }
        if ((uVar38 & 0xf000) == 0x4000) goto LAB_004034ef;
      }
    }
    *(undefined4 *)((long)puVar11 + 0x14) = 0xffffffff;
  }
  else {
    if ((si_00->ss).unpack_streams <= (ulong)(long)iVar7) goto LAB_0040336c;
    if (uVar28 < 0x10000) {
      *(undefined4 *)(puVar11 + 10) = 0x81b6;
    }
    if ((si_00->ss).digestsDefined[iVar7] != '\0') {
      *(uint *)(puVar11 + 3) = uVar30 | 8;
    }
    *(int *)((long)puVar11 + 0x14) = iVar7;
    iVar7 = iVar7 + 1;
  }
  if ((uVar28 & 1) != 0) {
    *(byte *)(puVar11 + 10) = (byte)puVar11[10] & 0x6d;
  }
  if (((ulong)puVar11[3] & 0x10) == 0 && uVar34 == 0) {
    *(undefined4 *)(puVar11 + 2) = 0xffffffff;
    uVar34 = 0;
  }
  else {
    if (uVar34 == 0) {
      while( true ) {
        if ((si_00->ci).numFolders <= (ulong)uVar29) goto LAB_0040336c;
        if (p_Var35[uVar29].numUnpackStreams != 0) break;
        uVar29 = uVar29 + 1;
      }
    }
    *(uint *)(puVar11 + 2) = uVar29;
    if (((ulong)puVar11[3] & 0x10) != 0) {
      uVar34 = uVar34 + 1;
      uVar19 = (ulong)uVar34;
      uVar39 = p_Var35[uVar29].numUnpackStreams;
      if (uVar39 <= uVar19) {
        uVar34 = 0;
      }
      uVar29 = uVar29 + (uVar39 <= uVar19);
    }
  }
  uVar32 = uVar32 + 1;
  goto LAB_004033bf;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no synname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	sprintf(zip->format_name, "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}